

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPool.c
# Opt level: O3

void sbfPoolAtExit(void)

{
  int iVar1;
  undefined4 uVar2;
  sbfPoolCountTree sVar3;
  sbfPoolCountTree *psVar4;
  sbfPoolCountImpl *psVar5;
  sbfPoolCountImpl *psVar6;
  sbfPoolCountImpl *elm;
  sbfPoolCountImpl *psVar7;
  sbfPoolCountImpl *psVar8;
  int iVar9;
  sbfPoolCountTree sVar10;
  sbfPoolCountImpl *psVar11;
  anon_struct_32_4_548b78d9_for_mTreeEntry *paVar12;
  sbfPoolCountImpl *old;
  ulong uVar13;
  sbfPoolCountImpl *psVar14;
  sbfPoolCountImpl *psVar15;
  
  if (gSbfPoolAtExitListSize != 0) {
    uVar13 = 0;
    do {
      sbfPool_destroy(gSbfPoolAtExitList[uVar13]);
      uVar13 = uVar13 + 1;
    } while (uVar13 < gSbfPoolAtExitListSize);
  }
  free(gSbfPoolAtExitList);
  gSbfPoolAtExitListSize = 0;
  psVar4 = &gSbfPoolCountTree;
  psVar14 = (sbfPoolCountImpl *)0x0;
  do {
    elm = psVar14;
    psVar14 = ((anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar4)->rbe_left;
    psVar4 = (sbfPoolCountTree *)&psVar14->mTreeEntry;
  } while (psVar14 != (sbfPoolCountImpl *)0x0);
joined_r0x00107c8c:
  if (elm == (sbfPoolCountImpl *)0x0) {
    return;
  }
  psVar5 = sbfPoolCountTreeImpl_RB_NEXT(elm);
  psVar14 = (elm->mTreeEntry).rbe_left;
  psVar6 = (elm->mTreeEntry).rbe_right;
  if (psVar14 == (sbfPoolCountImpl *)0x0) {
    psVar7 = (elm->mTreeEntry).rbe_parent;
    iVar9 = (elm->mTreeEntry).rbe_color;
    if (psVar6 != (sbfPoolCountImpl *)0x0) goto LAB_00107d78;
    psVar6 = (sbfPoolCountImpl *)0x0;
LAB_00107d84:
    paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
    if (psVar7 != (sbfPoolCountImpl *)0x0) {
      paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar7->mTreeEntry).rbe_right;
      if ((psVar7->mTreeEntry).rbe_left == elm) {
        paVar12 = &psVar7->mTreeEntry;
      }
    }
    paVar12->rbe_left = psVar6;
  }
  else {
    if (psVar6 == (sbfPoolCountImpl *)0x0) {
      psVar7 = (elm->mTreeEntry).rbe_parent;
      iVar9 = (elm->mTreeEntry).rbe_color;
      psVar6 = psVar14;
LAB_00107d78:
      (psVar6->mTreeEntry).rbe_parent = psVar7;
      goto LAB_00107d84;
    }
    do {
      psVar14 = psVar6;
      psVar6 = (psVar14->mTreeEntry).rbe_left;
    } while (psVar6 != (sbfPoolCountImpl *)0x0);
    psVar6 = (psVar14->mTreeEntry).rbe_right;
    psVar7 = (psVar14->mTreeEntry).rbe_parent;
    iVar9 = (psVar14->mTreeEntry).rbe_color;
    if (psVar6 != (sbfPoolCountImpl *)0x0) {
      (psVar6->mTreeEntry).rbe_parent = psVar7;
    }
    paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
    if (psVar7 != (sbfPoolCountImpl *)0x0) {
      paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar7->mTreeEntry).rbe_right;
      if ((psVar7->mTreeEntry).rbe_left == psVar14) {
        paVar12 = &psVar7->mTreeEntry;
      }
    }
    paVar12->rbe_left = psVar6;
    if ((psVar14->mTreeEntry).rbe_parent == elm) {
      psVar7 = psVar14;
    }
    psVar11 = (elm->mTreeEntry).rbe_left;
    psVar8 = (elm->mTreeEntry).rbe_right;
    iVar1 = (elm->mTreeEntry).rbe_color;
    uVar2 = *(undefined4 *)&(elm->mTreeEntry).field_0x1c;
    (psVar14->mTreeEntry).rbe_parent = (elm->mTreeEntry).rbe_parent;
    (psVar14->mTreeEntry).rbe_color = iVar1;
    *(undefined4 *)&(psVar14->mTreeEntry).field_0x1c = uVar2;
    (psVar14->mTreeEntry).rbe_left = psVar11;
    (psVar14->mTreeEntry).rbe_right = psVar8;
    psVar11 = (elm->mTreeEntry).rbe_parent;
    paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
    if (psVar11 != (sbfPoolCountImpl *)0x0) {
      paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar11->mTreeEntry).rbe_right;
      if ((psVar11->mTreeEntry).rbe_left == elm) {
        paVar12 = &psVar11->mTreeEntry;
      }
    }
    paVar12->rbe_left = psVar14;
    (((elm->mTreeEntry).rbe_left)->mTreeEntry).rbe_parent = psVar14;
    psVar11 = (elm->mTreeEntry).rbe_right;
    if (psVar11 != (sbfPoolCountImpl *)0x0) {
      (psVar11->mTreeEntry).rbe_parent = psVar14;
    }
    psVar14 = psVar7;
    if (psVar7 == (sbfPoolCountImpl *)0x0) {
      psVar7 = (sbfPoolCountImpl *)0x0;
    }
    else {
      do {
        psVar14 = (psVar14->mTreeEntry).rbe_parent;
      } while (psVar14 != (sbfPoolCountImpl *)0x0);
    }
  }
  sVar10.rbh_root = gSbfPoolCountTree.rbh_root;
  if (iVar9 == 0) {
    do {
      if (psVar6 == (sbfPoolCountImpl *)0x0) {
        if (sVar10.rbh_root == (sbfPoolCountImpl *)0x0) break;
      }
      else if (((psVar6->mTreeEntry).rbe_color != 0) || (psVar6 == sVar10.rbh_root))
      goto LAB_001080b1;
      psVar14 = (psVar7->mTreeEntry).rbe_left;
      psVar11 = sVar10.rbh_root;
      if (psVar14 == psVar6) {
        psVar14 = (psVar7->mTreeEntry).rbe_right;
        psVar8 = psVar14;
        if ((psVar14->mTreeEntry).rbe_color == 1) {
          (psVar14->mTreeEntry).rbe_color = 0;
          (psVar7->mTreeEntry).rbe_color = 1;
          psVar8 = (psVar14->mTreeEntry).rbe_left;
          (psVar7->mTreeEntry).rbe_right = psVar8;
          if (psVar8 != (sbfPoolCountImpl *)0x0) {
            (psVar8->mTreeEntry).rbe_parent = psVar7;
          }
          psVar6 = (psVar7->mTreeEntry).rbe_parent;
          (psVar14->mTreeEntry).rbe_parent = psVar6;
          psVar11 = psVar14;
          sVar3.rbh_root = psVar14;
          if (psVar6 != (sbfPoolCountImpl *)0x0) {
            if (psVar7 == (psVar6->mTreeEntry).rbe_left) {
              (psVar6->mTreeEntry).rbe_left = psVar14;
              psVar11 = sVar10.rbh_root;
              sVar3 = gSbfPoolCountTree;
            }
            else {
              (psVar6->mTreeEntry).rbe_right = psVar14;
              psVar8 = (psVar7->mTreeEntry).rbe_right;
              psVar11 = sVar10.rbh_root;
              sVar3 = gSbfPoolCountTree;
            }
          }
          gSbfPoolCountTree.rbh_root = sVar3.rbh_root;
          (psVar14->mTreeEntry).rbe_left = psVar7;
          (psVar7->mTreeEntry).rbe_parent = psVar14;
        }
        psVar14 = (psVar8->mTreeEntry).rbe_left;
        if ((psVar14 != (sbfPoolCountImpl *)0x0) && ((psVar14->mTreeEntry).rbe_color != 0)) {
          psVar6 = (psVar8->mTreeEntry).rbe_right;
          if ((psVar6 == (sbfPoolCountImpl *)0x0) || ((psVar6->mTreeEntry).rbe_color == 0)) {
            (psVar14->mTreeEntry).rbe_color = 0;
            (psVar8->mTreeEntry).rbe_color = 1;
            psVar6 = (psVar14->mTreeEntry).rbe_right;
            (psVar8->mTreeEntry).rbe_left = psVar6;
            if (psVar6 != (sbfPoolCountImpl *)0x0) {
              (psVar6->mTreeEntry).rbe_parent = psVar8;
            }
            psVar6 = (psVar8->mTreeEntry).rbe_parent;
            (psVar14->mTreeEntry).rbe_parent = psVar6;
            psVar15 = psVar14;
            paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
            if (psVar6 != (sbfPoolCountImpl *)0x0) {
              psVar15 = psVar11;
              paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar6->mTreeEntry).rbe_right;
              if (psVar8 == (psVar6->mTreeEntry).rbe_left) {
                paVar12 = &psVar6->mTreeEntry;
              }
            }
            paVar12->rbe_left = psVar14;
            (psVar14->mTreeEntry).rbe_right = psVar8;
            (psVar8->mTreeEntry).rbe_parent = psVar14;
            psVar8 = (psVar7->mTreeEntry).rbe_right;
            psVar6 = (psVar8->mTreeEntry).rbe_right;
            (psVar8->mTreeEntry).rbe_color = (psVar7->mTreeEntry).rbe_color;
            (psVar7->mTreeEntry).rbe_color = 0;
            if (psVar6 != (sbfPoolCountImpl *)0x0) goto LAB_00108062;
          }
          else {
LAB_00107f2e:
            (psVar8->mTreeEntry).rbe_color = (psVar7->mTreeEntry).rbe_color;
            (psVar7->mTreeEntry).rbe_color = 0;
            psVar15 = psVar11;
LAB_00108062:
            (psVar6->mTreeEntry).rbe_color = 0;
          }
          psVar14 = (psVar8->mTreeEntry).rbe_left;
          (psVar7->mTreeEntry).rbe_right = psVar14;
          if (psVar14 != (sbfPoolCountImpl *)0x0) {
            (psVar14->mTreeEntry).rbe_parent = psVar7;
          }
          psVar14 = (psVar7->mTreeEntry).rbe_parent;
          (psVar8->mTreeEntry).rbe_parent = psVar14;
          paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
          psVar6 = psVar8;
          if (psVar14 != (sbfPoolCountImpl *)0x0) {
            paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar14->mTreeEntry).rbe_right;
            psVar6 = psVar15;
            if (psVar7 == (psVar14->mTreeEntry).rbe_left) {
              paVar12 = &psVar14->mTreeEntry;
            }
          }
          paVar12->rbe_left = psVar8;
          (psVar8->mTreeEntry).rbe_left = psVar7;
          goto LAB_001080a8;
        }
        psVar6 = (psVar8->mTreeEntry).rbe_right;
        if ((psVar6 != (sbfPoolCountImpl *)0x0) && ((psVar6->mTreeEntry).rbe_color != 0))
        goto LAB_00107f2e;
      }
      else {
        psVar8 = psVar14;
        if ((psVar14->mTreeEntry).rbe_color == 1) {
          (psVar14->mTreeEntry).rbe_color = 0;
          (psVar7->mTreeEntry).rbe_color = 1;
          psVar8 = (psVar14->mTreeEntry).rbe_right;
          (psVar7->mTreeEntry).rbe_left = psVar8;
          if (psVar8 != (sbfPoolCountImpl *)0x0) {
            (psVar8->mTreeEntry).rbe_parent = psVar7;
          }
          psVar6 = (psVar7->mTreeEntry).rbe_parent;
          (psVar14->mTreeEntry).rbe_parent = psVar6;
          psVar11 = psVar14;
          sVar3.rbh_root = psVar14;
          if (psVar6 != (sbfPoolCountImpl *)0x0) {
            if (psVar7 == (psVar6->mTreeEntry).rbe_left) {
              (psVar6->mTreeEntry).rbe_left = psVar14;
              psVar8 = (psVar7->mTreeEntry).rbe_left;
              psVar11 = sVar10.rbh_root;
              sVar3 = gSbfPoolCountTree;
            }
            else {
              (psVar6->mTreeEntry).rbe_right = psVar14;
              psVar11 = sVar10.rbh_root;
              sVar3 = gSbfPoolCountTree;
            }
          }
          gSbfPoolCountTree.rbh_root = sVar3.rbh_root;
          (psVar14->mTreeEntry).rbe_right = psVar7;
          (psVar7->mTreeEntry).rbe_parent = psVar14;
        }
        psVar14 = (psVar8->mTreeEntry).rbe_left;
        if ((psVar14 != (sbfPoolCountImpl *)0x0) && ((psVar14->mTreeEntry).rbe_color != 0))
        goto LAB_00107f01;
        psVar6 = (psVar8->mTreeEntry).rbe_right;
        if ((psVar6 != (sbfPoolCountImpl *)0x0) && ((psVar6->mTreeEntry).rbe_color != 0))
        goto LAB_00107ef5;
      }
      (psVar8->mTreeEntry).rbe_color = 1;
      psVar6 = psVar7;
      psVar7 = (psVar7->mTreeEntry).rbe_parent;
      sVar10.rbh_root = psVar11;
    } while( true );
  }
  goto LAB_001080b8;
LAB_00107ef5:
  if ((psVar14 == (sbfPoolCountImpl *)0x0) || ((psVar14->mTreeEntry).rbe_color == 0)) {
    (psVar6->mTreeEntry).rbe_color = 0;
    (psVar8->mTreeEntry).rbe_color = 1;
    psVar14 = (psVar6->mTreeEntry).rbe_left;
    (psVar8->mTreeEntry).rbe_right = psVar14;
    if (psVar14 != (sbfPoolCountImpl *)0x0) {
      (psVar14->mTreeEntry).rbe_parent = psVar8;
    }
    psVar14 = (psVar8->mTreeEntry).rbe_parent;
    (psVar6->mTreeEntry).rbe_parent = psVar14;
    psVar15 = psVar6;
    paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
    if (psVar14 != (sbfPoolCountImpl *)0x0) {
      psVar15 = psVar11;
      paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar14->mTreeEntry).rbe_right;
      if (psVar8 == (psVar14->mTreeEntry).rbe_left) {
        paVar12 = &psVar14->mTreeEntry;
      }
    }
    paVar12->rbe_left = psVar6;
    (psVar6->mTreeEntry).rbe_left = psVar8;
    (psVar8->mTreeEntry).rbe_parent = psVar6;
    psVar8 = (psVar7->mTreeEntry).rbe_left;
    psVar14 = (psVar8->mTreeEntry).rbe_left;
    (psVar8->mTreeEntry).rbe_color = (psVar7->mTreeEntry).rbe_color;
    (psVar7->mTreeEntry).rbe_color = 0;
    if (psVar14 == (sbfPoolCountImpl *)0x0) goto LAB_00107fb5;
  }
  else {
LAB_00107f01:
    (psVar8->mTreeEntry).rbe_color = (psVar7->mTreeEntry).rbe_color;
    (psVar7->mTreeEntry).rbe_color = 0;
    psVar15 = psVar11;
  }
  (psVar14->mTreeEntry).rbe_color = 0;
LAB_00107fb5:
  psVar14 = (psVar8->mTreeEntry).rbe_right;
  (psVar7->mTreeEntry).rbe_left = psVar14;
  if (psVar14 != (sbfPoolCountImpl *)0x0) {
    (psVar14->mTreeEntry).rbe_parent = psVar7;
  }
  psVar14 = (psVar7->mTreeEntry).rbe_parent;
  (psVar8->mTreeEntry).rbe_parent = psVar14;
  paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
  psVar6 = psVar8;
  if (psVar14 != (sbfPoolCountImpl *)0x0) {
    paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar14->mTreeEntry).rbe_right;
    psVar6 = psVar15;
    if (psVar7 == (psVar14->mTreeEntry).rbe_left) {
      paVar12 = &psVar14->mTreeEntry;
    }
  }
  paVar12->rbe_left = psVar8;
  (psVar8->mTreeEntry).rbe_right = psVar7;
LAB_001080a8:
  (psVar7->mTreeEntry).rbe_parent = psVar8;
  if (psVar6 != (sbfPoolCountImpl *)0x0) {
LAB_001080b1:
    (psVar6->mTreeEntry).rbe_color = 0;
  }
LAB_001080b8:
  free(elm);
  elm = psVar5;
  goto joined_r0x00107c8c;
}

Assistant:

static void
sbfPoolAtExit (void)
{
    u_int        i;
    sbfPoolCount count;
    sbfPoolCount count1;

    for (i = 0; i < gSbfPoolAtExitListSize; i++)
        sbfPool_destroy (gSbfPoolAtExitList[i]);
    free (gSbfPoolAtExitList);
    gSbfPoolAtExitListSize = 0;

    RB_FOREACH_SAFE (count, sbfPoolCountTreeImpl, &gSbfPoolCountTree, count1)
    {
        RB_REMOVE (sbfPoolCountTreeImpl, &gSbfPoolCountTree, count);
        free (count);
    }
}